

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall btMultiBody::finalizeMultiDof(btMultiBody *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  float *pfVar6;
  btVector3 *ptr;
  btMultibodyLink *pbVar7;
  float *pfVar8;
  btVector3 *pbVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  
  lVar14 = (long)(this->m_deltaV).m_size;
  if (lVar14 < 0) {
    pfVar8 = (this->m_deltaV).m_data;
    if ((this->m_deltaV).m_capacity < 0) {
      if (pfVar8 == (float *)0x0) {
        (this->m_deltaV).m_ownsMemory = true;
      }
      else {
        if ((this->m_deltaV).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar8);
        }
        (this->m_deltaV).m_ownsMemory = true;
        (this->m_deltaV).m_data = (float *)0x0;
      }
      (this->m_deltaV).m_capacity = 0;
      pfVar8 = (float *)0x0;
    }
    memset(pfVar8 + lVar14,0,lVar14 * -4);
  }
  (this->m_deltaV).m_size = 0;
  iVar15 = this->m_dofCount;
  uVar12 = (long)iVar15 + 6;
  iVar13 = (int)uVar12;
  if (-6 < (long)iVar15) {
    if ((this->m_deltaV).m_capacity < iVar13) {
      pfVar8 = (float *)btAlignedAllocInternal((uVar12 & 0xffffffff) << 2,0x10);
      lVar14 = (long)(this->m_deltaV).m_size;
      pfVar6 = (this->m_deltaV).m_data;
      if (lVar14 < 1) {
        if (pfVar6 != (float *)0x0) goto LAB_001b1c52;
      }
      else {
        lVar11 = 0;
        do {
          pfVar8[lVar11] = pfVar6[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar14 != lVar11);
LAB_001b1c52:
        if ((this->m_deltaV).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar6);
        }
      }
      (this->m_deltaV).m_ownsMemory = true;
      (this->m_deltaV).m_data = pfVar8;
      (this->m_deltaV).m_capacity = iVar13;
    }
    else {
      pfVar8 = (this->m_deltaV).m_data;
    }
    memset(pfVar8,0,uVar12 * 4);
    iVar15 = this->m_dofCount;
  }
  (this->m_deltaV).m_size = iVar13;
  iVar13 = (iVar15 + 2) * iVar15 + 0xc;
  uVar10 = (this->m_realBuf).m_size;
  if (iVar13 <= (int)uVar10) goto LAB_001b1d4b;
  lVar14 = (long)(int)uVar10;
  if ((this->m_realBuf).m_capacity < iVar13) {
    if (iVar13 == 0) {
      pfVar8 = (float *)0x0;
    }
    else {
      pfVar8 = (float *)btAlignedAllocInternal((long)iVar13 * 4,0x10);
      uVar10 = (this->m_realBuf).m_size;
    }
    pfVar6 = (this->m_realBuf).m_data;
    if ((int)uVar10 < 1) {
      if (pfVar6 != (float *)0x0) goto LAB_001b1d0e;
    }
    else {
      uVar12 = 0;
      do {
        pfVar8[uVar12] = pfVar6[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
LAB_001b1d0e:
      if ((this->m_realBuf).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar6);
      }
    }
    (this->m_realBuf).m_ownsMemory = true;
    (this->m_realBuf).m_data = pfVar8;
    (this->m_realBuf).m_capacity = iVar13;
  }
  else {
    pfVar8 = (this->m_realBuf).m_data;
  }
  memset(pfVar8 + lVar14,0,(iVar13 - lVar14) * 4);
  iVar15 = this->m_dofCount;
LAB_001b1d4b:
  (this->m_realBuf).m_size = iVar13;
  iVar13 = iVar15 * 2;
  uVar10 = (this->m_vectorBuf).m_size;
  if ((SBORROW4(uVar10,iVar13) != (int)(uVar10 + iVar15 * -2) < 0) &&
     (iVar5 = (this->m_vectorBuf).m_capacity, SBORROW4(iVar5,iVar13) != iVar5 + iVar15 * -2 < 0)) {
    if (iVar15 == 0) {
      pbVar9 = (btVector3 *)0x0;
    }
    else {
      pbVar9 = (btVector3 *)btAlignedAllocInternal((long)iVar13 << 4,0x10);
      uVar10 = (this->m_vectorBuf).m_size;
    }
    if (0 < (int)uVar10) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_vectorBuf).m_data)->m_floats + lVar14);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar9->m_floats + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar14 = lVar14 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar14);
    }
    ptr = (this->m_vectorBuf).m_data;
    if ((ptr != (btVector3 *)0x0) && ((this->m_vectorBuf).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_vectorBuf).m_ownsMemory = true;
    (this->m_vectorBuf).m_data = pbVar9;
    (this->m_vectorBuf).m_capacity = iVar13;
  }
  (this->m_vectorBuf).m_size = iVar13;
  lVar14 = (long)(this->m_links).m_size;
  if (0 < lVar14) {
    pbVar7 = (this->m_links).m_data;
    iVar15 = 0;
    iVar13 = 0;
    lVar11 = 0;
    do {
      piVar3 = (int *)((long)(pbVar7->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                      lVar11 + -8);
      *piVar3 = iVar15;
      piVar3[1] = iVar13;
      uVar4 = *(undefined8 *)
               ((long)(pbVar7->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar11 + -0x14);
      iVar15 = iVar15 + (int)uVar4;
      iVar13 = iVar13 + (int)((ulong)uVar4 >> 0x20);
      lVar11 = lVar11 + 600;
    } while (lVar14 * 600 - lVar11 != 0);
  }
  return;
}

Assistant:

void btMultiBody::finalizeMultiDof()
{
	m_deltaV.resize(0);
	m_deltaV.resize(6 + m_dofCount);
	m_realBuf.resize(6 + m_dofCount + m_dofCount*m_dofCount + 6 + m_dofCount);			//m_dofCount for joint-space vels + m_dofCount^2 for "D" matrices + delta-pos vector (6 base "vels" + joint "vels")
	m_vectorBuf.resize(2 * m_dofCount);													//two 3-vectors (i.e. one six-vector) for each system dof	("h" matrices)

	updateLinksDofOffsets();
}